

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriCommon.c
# Opt level: O0

UriBool uriRemoveDotSegmentsExW
                  (UriUriW *uri,UriBool relative,UriBool pathOwned,UriMemoryManager *memory)

{
  long *plVar1;
  void *pvVar2;
  UriPathSegmentW *pUVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  UriBool UVar7;
  UriPathSegmentW *pUVar8;
  wchar_t freeWalker;
  UriPathSegmentW *anotherNextBackup;
  UriPathSegmentW *segment_1;
  UriPathSegmentW *segment;
  UriPathSegmentW *nextBackup_1;
  UriPathSegmentW *prevPrev;
  UriPathSegmentW *prev_1;
  wchar_t *ch;
  UriPathSegmentW *nextBackup;
  UriPathSegmentW *prev;
  wchar_t len;
  UriBool removeSegment;
  UriPathSegmentW *walker;
  UriMemoryManager *memory_local;
  UriBool pathOwned_local;
  UriBool relative_local;
  UriUriW *uri_local;
  
  if ((uri != (UriUriW *)0x0) && (uri->pathHead != (UriPathSegmentW *)0x0)) {
    _len = uri->pathHead;
    _len->reserved = (void *)0x0;
    do {
      bVar4 = false;
      iVar6 = (int)((ulong)((long)(_len->text).afterLast - (long)(_len->text).first) >> 2);
      pUVar3 = _len;
      if (iVar6 == 1) {
        if (*(_len->text).first == L'.') {
          pvVar2 = _len->reserved;
          pUVar8 = _len->next;
          bVar4 = true;
          if (((relative != 0) && (_len == uri->pathHead)) &&
             (_len->next != (UriPathSegmentStructW *)0x0)) {
            for (prev_1 = (UriPathSegmentW *)(_len->next->text).first;
                prev_1 < (UriPathSegmentW *)(_len->next->text).afterLast;
                prev_1 = (UriPathSegmentW *)((long)&(prev_1->text).first + 4)) {
              if (*(int *)&(prev_1->text).first == 0x3a) {
                bVar4 = false;
                break;
              }
            }
          }
          if (bVar4) {
            pUVar3 = pUVar8;
            if (_len->next == (UriPathSegmentStructW *)0x0) {
              if ((pathOwned != 0) && ((_len->text).first != (_len->text).afterLast)) {
                (*memory->free)(memory,(_len->text).first);
              }
              if (pvVar2 == (void *)0x0) {
                UVar7 = uriIsHostSetW(uri);
                if (UVar7 == 0) {
                  (*memory->free)(memory,_len);
                  uri->pathHead = (UriPathSegmentW *)0x0;
                  uri->pathTail = (UriPathSegmentW *)0x0;
                }
                else {
                  (_len->text).first = anon_var_dwarf_8de7f;
                  (_len->text).afterLast = anon_var_dwarf_8de7f;
                }
              }
              else {
                (_len->text).first = anon_var_dwarf_8de7f;
                (_len->text).afterLast = anon_var_dwarf_8de7f;
              }
            }
            else {
              _len->next->reserved = pvVar2;
              if (pvVar2 == (void *)0x0) {
                uri->pathHead = _len->next;
              }
              else {
                *(UriPathSegmentStructW **)((long)pvVar2 + 0x10) = _len->next;
              }
              if ((pathOwned != 0) && ((_len->text).first != (_len->text).afterLast)) {
                (*memory->free)(memory,(_len->text).first);
              }
              (*memory->free)(memory,_len);
            }
          }
        }
      }
      else if (((iVar6 == 2) && (*(_len->text).first == L'.')) && ((_len->text).first[1] == L'.')) {
        plVar1 = (long *)_len->reserved;
        pUVar8 = _len->next;
        bVar4 = true;
        if (relative != 0) {
          if (plVar1 == (long *)0x0) {
            bVar4 = false;
          }
          else if (((plVar1 != (long *)0x0) && (plVar1[1] - *plVar1 >> 2 == 2)) &&
                  ((*(int *)*plVar1 == 0x2e && (*(int *)(*plVar1 + 4) == 0x2e)))) {
            bVar4 = false;
          }
        }
        if (bVar4) {
          if (plVar1 == (long *)0x0) {
            pUVar3 = _len->next;
            bVar5 = true;
            if (_len->next == (UriPathSegmentStructW *)0x0) {
              if (uri->absolutePath == 0) {
                if ((pathOwned != 0) && ((_len->text).first != (_len->text).afterLast)) {
                  (*memory->free)(memory,(_len->text).first);
                }
                (_len->text).first = anon_var_dwarf_8de7f;
                (_len->text).afterLast = anon_var_dwarf_8de7f;
                bVar5 = false;
              }
              else {
                uri->pathHead = (UriPathSegmentW *)0x0;
                uri->pathTail = (UriPathSegmentW *)0x0;
              }
            }
            else {
              uri->pathHead = _len->next;
              _len->next->reserved = (void *)0x0;
            }
            if (bVar5) {
              if ((pathOwned != 0) && ((_len->text).first != (_len->text).afterLast)) {
                (*memory->free)(memory,(_len->text).first);
              }
              (*memory->free)(memory,_len);
            }
          }
          else {
            pvVar2 = (void *)plVar1[3];
            pUVar3 = pUVar8;
            if (pvVar2 == (void *)0x0) {
              if (_len->next == (UriPathSegmentStructW *)0x0) {
                if ((pathOwned != 0) && ((_len->text).first != (_len->text).afterLast)) {
                  (*memory->free)(memory,(_len->text).first);
                }
                (_len->text).first = anon_var_dwarf_8de7f;
                (_len->text).afterLast = anon_var_dwarf_8de7f;
                uri->pathHead = _len;
                uri->pathTail = _len;
              }
              else {
                uri->pathHead = _len->next;
                _len->next->reserved = (void *)0x0;
                if ((pathOwned != 0) && ((_len->text).first != (_len->text).afterLast)) {
                  (*memory->free)(memory,(_len->text).first);
                }
                (*memory->free)(memory,_len);
              }
              if ((pathOwned != 0) && (*plVar1 != plVar1[1])) {
                (*memory->free)(memory,(void *)*plVar1);
              }
              (*memory->free)(memory,plVar1);
            }
            else {
              *(UriPathSegmentStructW **)((long)pvVar2 + 0x10) = _len->next;
              if (_len->next == (UriPathSegmentStructW *)0x0) {
                pUVar8 = (UriPathSegmentW *)(*memory->calloc)(memory,1,0x20);
                if (pUVar8 == (UriPathSegmentW *)0x0) {
                  if ((pathOwned != 0) && ((_len->text).first != (_len->text).afterLast)) {
                    (*memory->free)(memory,(_len->text).first);
                  }
                  (*memory->free)(memory,_len);
                  if ((pathOwned != 0) && (*plVar1 != plVar1[1])) {
                    (*memory->free)(memory,(void *)*plVar1);
                  }
                  (*memory->free)(memory,plVar1);
                  return 0;
                }
                (pUVar8->text).first = anon_var_dwarf_8de7f;
                (pUVar8->text).afterLast = anon_var_dwarf_8de7f;
                *(UriPathSegmentW **)((long)pvVar2 + 0x10) = pUVar8;
                uri->pathTail = pUVar8;
              }
              else {
                _len->next->reserved = pvVar2;
              }
              if ((pathOwned != 0) && ((_len->text).first != (_len->text).afterLast)) {
                (*memory->free)(memory,(_len->text).first);
              }
              (*memory->free)(memory,_len);
              if ((pathOwned != 0) && (*plVar1 != plVar1[1])) {
                (*memory->free)(memory,(void *)*plVar1);
              }
              (*memory->free)(memory,plVar1);
            }
          }
        }
      }
      _len = pUVar3;
      if (!bVar4) {
        if (_len->next == (UriPathSegmentStructW *)0x0) {
          uri->pathTail = _len;
        }
        else {
          _len->next->reserved = _len;
        }
        _len = _len->next;
      }
    } while (_len != (UriPathSegmentW *)0x0);
  }
  return 1;
}

Assistant:

UriBool URI_FUNC(RemoveDotSegmentsEx)(URI_TYPE(Uri) * uri,
		UriBool relative, UriBool pathOwned, UriMemoryManager * memory) {
	URI_TYPE(PathSegment) * walker;
	if ((uri == NULL) || (uri->pathHead == NULL)) {
		return URI_TRUE;
	}

	walker = uri->pathHead;
	walker->reserved = NULL; /* Prev pointer */
	do {
		UriBool removeSegment = URI_FALSE;
		int len = (int)(walker->text.afterLast - walker->text.first);
		switch (len) {
		case 1:
			if ((walker->text.first)[0] == _UT('.')) {
				/* "." segment -> remove if not essential */
				URI_TYPE(PathSegment) * const prev = walker->reserved;
				URI_TYPE(PathSegment) * const nextBackup = walker->next;

				/*
				 * Is this dot segment essential,
				 * i.e. is there a chance of changing semantics by dropping this dot segment?
				 *
				 * For example, changing "./http://foo" into "http://foo" would change semantics
				 * and hence the dot segment is essential to that case and cannot be removed.
				 */
				removeSegment = URI_TRUE;
				if (relative && (walker == uri->pathHead) && (walker->next != NULL)) {
					const URI_CHAR * ch = walker->next->text.first;
					for (; ch < walker->next->text.afterLast; ch++) {
						if (*ch == _UT(':')) {
							removeSegment = URI_FALSE;
							break;
						}
					}
				}

				if (removeSegment) {
					/* .. then let's go remove that segment. */
					/* Last segment? */
					if (walker->next != NULL) {
						/* Not last segment, i.e. first or middle segment
						 * OLD: (prev|NULL) <- walker <- next
						 * NEW: (prev|NULL) <----------- next */
						walker->next->reserved = prev;

						if (prev == NULL) {
							/* First but not last segment
							 * OLD: head -> walker -> next
							 * NEW: head -----------> next */
							uri->pathHead = walker->next;
						} else {
							/* Middle segment
							 * OLD: prev -> walker -> next
							 * NEW: prev -----------> next */
							prev->next = walker->next;
						}

						if (pathOwned && (walker->text.first != walker->text.afterLast)) {
							memory->free(memory, (URI_CHAR *)walker->text.first);
						}
						memory->free(memory, walker);
					} else {
						/* Last segment */
						if (pathOwned && (walker->text.first != walker->text.afterLast)) {
							memory->free(memory, (URI_CHAR *)walker->text.first);
						}

						if (prev == NULL) {
							/* Last and first */
							if (URI_FUNC(IsHostSet)(uri)) {
								/* Replace "." with empty segment to represent trailing slash */
								walker->text.first = URI_FUNC(SafeToPointTo);
								walker->text.afterLast = URI_FUNC(SafeToPointTo);
							} else {
								memory->free(memory, walker);

								uri->pathHead = NULL;
								uri->pathTail = NULL;
							}
						} else {
							/* Last but not first, replace "." with empty segment to represent trailing slash */
							walker->text.first = URI_FUNC(SafeToPointTo);
							walker->text.afterLast = URI_FUNC(SafeToPointTo);
						}
					}

					walker = nextBackup;
				}
			}
			break;

		case 2:
			if (((walker->text.first)[0] == _UT('.'))
					&& ((walker->text.first)[1] == _UT('.'))) {
				/* Path ".." -> remove this and the previous segment */
				URI_TYPE(PathSegment) * const prev = walker->reserved;
				URI_TYPE(PathSegment) * prevPrev;
				URI_TYPE(PathSegment) * const nextBackup = walker->next;

				removeSegment = URI_TRUE;
				if (relative) {
					if (prev == NULL) {
						/* We cannot remove traversal beyond because the
						 * URI is relative and may be resolved later.
						 * So we can simplify "a/../b/d" to "b/d" but
						 * we cannot simplify "../b/d" (outside of reference resolution). */
						removeSegment = URI_FALSE;
					} else if ((prev != NULL)
							&& ((prev->text.afterLast - prev->text.first) == 2)
							&& ((prev->text.first)[0] == _UT('.'))
							&& ((prev->text.first)[1] == _UT('.'))) {
						/* We need to protect against mis-simplifying "a/../../b" to "a/b". */
						removeSegment = URI_FALSE;
					}
				}

				if (removeSegment) {
					if (prev != NULL) {
						/* Not first segment */
						prevPrev = prev->reserved;
						if (prevPrev != NULL) {
							/* Not even prev is the first one
							 * OLD: prevPrev -> prev -> walker -> (next|NULL)
							 * NEW: prevPrev -------------------> (next|NULL) */
							prevPrev->next = walker->next;
							if (walker->next != NULL) {
								/* Update parent relationship as well
								 * OLD: prevPrev <- prev <- walker <- next
								 * NEW: prevPrev <------------------- next */
								walker->next->reserved = prevPrev;
							} else {
								/* Last segment -> insert "" segment to represent trailing slash, update tail */
								URI_TYPE(PathSegment) * const segment = memory->calloc(memory, 1, sizeof(URI_TYPE(PathSegment)));
								if (segment == NULL) {
									if (pathOwned && (walker->text.first != walker->text.afterLast)) {
										memory->free(memory, (URI_CHAR *)walker->text.first);
									}
									memory->free(memory, walker);

									if (pathOwned && (prev->text.first != prev->text.afterLast)) {
										memory->free(memory, (URI_CHAR *)prev->text.first);
									}
									memory->free(memory, prev);

									return URI_FALSE; /* Raises malloc error */
								}
								segment->text.first = URI_FUNC(SafeToPointTo);
								segment->text.afterLast = URI_FUNC(SafeToPointTo);
								prevPrev->next = segment;
								uri->pathTail = segment;
							}

							if (pathOwned && (walker->text.first != walker->text.afterLast)) {
								memory->free(memory, (URI_CHAR *)walker->text.first);
							}
							memory->free(memory, walker);

							if (pathOwned && (prev->text.first != prev->text.afterLast)) {
								memory->free(memory, (URI_CHAR *)prev->text.first);
							}
							memory->free(memory, prev);

							walker = nextBackup;
						} else {
							/* Prev is the first segment */
							if (walker->next != NULL) {
								uri->pathHead = walker->next;
								walker->next->reserved = NULL;

								if (pathOwned && (walker->text.first != walker->text.afterLast)) {
									memory->free(memory, (URI_CHAR *)walker->text.first);
								}
								memory->free(memory, walker);
							} else {
								/* Re-use segment for "" path segment to represent trailing slash, update tail */
								URI_TYPE(PathSegment) * const segment = walker;
								if (pathOwned && (segment->text.first != segment->text.afterLast)) {
									memory->free(memory, (URI_CHAR *)segment->text.first);
								}
								segment->text.first = URI_FUNC(SafeToPointTo);
								segment->text.afterLast = URI_FUNC(SafeToPointTo);
								uri->pathHead = segment;
								uri->pathTail = segment;
							}

							if (pathOwned && (prev->text.first != prev->text.afterLast)) {
								memory->free(memory, (URI_CHAR *)prev->text.first);
							}
							memory->free(memory, prev);

							walker = nextBackup;
						}
					} else {
						URI_TYPE(PathSegment) * const anotherNextBackup = walker->next;
						int freeWalker = URI_TRUE;

						/* First segment */
						if (walker->next != NULL) {
							/* First segment of multiple -> update head
							 * OLD: head -> walker -> next
							 * NEW: head -----------> next */
							uri->pathHead = walker->next;

							/* Update parent link as well
							 * OLD: head <- walker <- next
							 * NEW: head <----------- next */
							walker->next->reserved = NULL;
						} else {
							if (uri->absolutePath) {
								/* First and only segment -> update head
								 * OLD: head -> walker -> NULL
								 * NEW: head -----------> NULL */
								uri->pathHead = NULL;

								/* Last segment -> update tail
								 * OLD: tail -> walker
								 * NEW: tail -> NULL */
								uri->pathTail = NULL;
							} else {
								/* Re-use segment for "" path segment to represent trailing slash,
								 * then update head and tail */
								if (pathOwned && (walker->text.first != walker->text.afterLast)) {
									memory->free(memory, (URI_CHAR *)walker->text.first);
								}
								walker->text.first = URI_FUNC(SafeToPointTo);
								walker->text.afterLast = URI_FUNC(SafeToPointTo);
								freeWalker = URI_FALSE;
							}
						}

						if (freeWalker) {
							if (pathOwned && (walker->text.first != walker->text.afterLast)) {
								memory->free(memory, (URI_CHAR *)walker->text.first);
							}
							memory->free(memory, walker);
						}

						walker = anotherNextBackup;
					}
				}
			}
			break;
		} /* end of switch */

		if (!removeSegment) {
			/* .. then let's move to the next element, and start again. */
			if (walker->next != NULL) {
				walker->next->reserved = walker;
			} else {
				/* Last segment -> update tail */
				uri->pathTail = walker;
			}
			walker = walker->next;
		}
	} while (walker != NULL);

	return URI_TRUE;
}